

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int vcf_parse(kstring_t *s,bcf_hdr_t *h,bcf1_t *v)

{
  kstring_t *s_00;
  uint uVar1;
  int32_t x;
  uint *puVar2;
  size_t sVar3;
  long lVar4;
  double dVar5;
  undefined8 q;
  char cVar6;
  anon_union_4_2_947300a4 u;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  bcf_idpair_t *pbVar11;
  bcf_idpair_t *pbVar12;
  bcf_idpair_t *pbVar13;
  long lVar14;
  bcf_hrec_t *pbVar15;
  byte bVar16;
  byte bVar17;
  char *pcVar18;
  bcf_idpair_t *pbVar19;
  int32_t *a;
  char *pcVar20;
  bcf_idpair_t *pbVar21;
  uint uVar22;
  float *a_00;
  size_t sVar23;
  bcf_hdr_t *pbVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  bool bVar28;
  undefined1 auStack_128 [8];
  ks_tokaux_t aux;
  int l_2;
  undefined1 auStack_e8 [8];
  int l;
  undefined4 uStack_dc;
  bcf_idpair_t *local_d8;
  undefined1 auStack_c8 [8];
  kstring_t tmp;
  bcf_hrec_t **local_a0;
  
  a_00 = (float *)auStack_128;
  bcf_clear(v);
  aux.tab[3] = 0;
  aux.sep = 0;
  aux.finished = 0;
  aux.tab[1] = 0;
  aux.tab[2] = 0;
  auStack_128 = (undefined1  [8])0x0;
  aux.tab[0] = 0;
  pbVar11 = (bcf_idpair_t *)kstrtok(s->s,"\t",(ks_tokaux_t *)auStack_128);
  if (pbVar11 == (bcf_idpair_t *)0x0) {
    return 0;
  }
  s_00 = &v->shared;
  iVar10 = 0;
LAB_0011dfc2:
  q = aux._32_8_;
  *(undefined1 *)aux._32_8_ = 0;
  iVar7 = aux.sep;
  switch(iVar10) {
  case 0:
    puVar2 = (uint *)h->dict[1];
    uVar25 = *puVar2;
    if (uVar25 == 0) {
      uVar26 = 0;
    }
    else {
      uVar27 = (uint)*(char *)&pbVar11->key;
      if (*(char *)&pbVar11->key == '\0') {
        uVar27 = 0;
      }
      else {
        cVar6 = *(char *)((long)&pbVar11->key + 1);
        if (cVar6 != '\0') {
          pcVar18 = (char *)((long)&pbVar11->key + 2);
          do {
            uVar27 = (int)cVar6 + uVar27 * 0x1f;
            cVar6 = *pcVar18;
            pcVar18 = pcVar18 + 1;
          } while (cVar6 != '\0');
        }
      }
      uVar27 = uVar27 & uVar25 - 1;
      lVar14 = *(long *)(puVar2 + 4);
      iVar7 = 1;
      uVar22 = uVar27;
      do {
        uVar1 = *(uint *)(lVar14 + (ulong)(uVar22 >> 4) * 4);
        bVar17 = (char)uVar22 * '\x02' & 0x1e;
        uVar8 = uVar1 >> bVar17;
        if ((uVar8 & 2) != 0) {
LAB_0011ec12:
          uVar26 = (ulong)uVar22;
          if ((uVar1 >> bVar17 & 3) != 0) {
            uVar26 = (ulong)uVar25;
          }
          break;
        }
        if ((uVar8 & 1) == 0) {
          pcVar18 = *(char **)(*(long *)(puVar2 + 6) + (ulong)uVar22 * 8);
          *(undefined8 *)((long)a_00 + -8) = 0x11ebf1;
          iVar9 = strcmp(pcVar18,(char *)pbVar11);
          if (iVar9 == 0) goto LAB_0011ec12;
        }
        uVar22 = uVar22 + iVar7 & uVar25 - 1;
        iVar7 = iVar7 + 1;
        uVar26 = (ulong)uVar25;
      } while (uVar22 != uVar27);
    }
    if ((uint)uVar26 == uVar25) {
      *(undefined8 *)((long)a_00 + -8) = 0x11ecca;
      fprintf(_stderr,
              "[W::%s] contig \'%s\' is not defined in the header. (Quick workaround: index the file with tabix.)\n"
              ,"vcf_parse",pbVar11);
      auStack_c8 = (undefined1  [8])0x0;
      tmp.l = 0;
      tmp.m = 0;
      pbVar24 = (bcf_hdr_t *)auStack_c8;
      *(undefined8 *)((long)a_00 + -8) = 0x11ecf7;
      ksprintf((kstring_t *)pbVar24,"##contig=<ID=%s>",pbVar11);
      sVar3 = tmp.m;
      *(undefined8 *)((long)a_00 + -8) = 0x11ed0a;
      pbVar15 = bcf_hdr_parse_line(pbVar24,(char *)sVar3,(int *)auStack_e8);
      sVar3 = tmp.m;
      *(undefined8 *)((long)a_00 + -8) = 0x11ed19;
      free((void *)sVar3);
      *(undefined8 *)((long)a_00 + -8) = 0x11ed28;
      iVar7 = bcf_hdr_add_hrec(h,pbVar15);
      if (iVar7 != 0) {
        *(undefined8 *)((long)a_00 + -8) = 0x11ed34;
        bcf_hdr_sync(h);
      }
      uVar25 = *puVar2;
      uVar26 = (ulong)uVar25;
      if (uVar25 == 0) {
        uVar26 = 0;
      }
      else {
        uVar27 = (uint)*(char *)&pbVar11->key;
        if (*(char *)&pbVar11->key == '\0') {
          uVar27 = 0;
        }
        else {
          cVar6 = *(char *)((long)&pbVar11->key + 1);
          if (cVar6 != '\0') {
            pcVar18 = (char *)((long)&pbVar11->key + 2);
            do {
              uVar27 = (int)cVar6 + uVar27 * 0x1f;
              cVar6 = *pcVar18;
              pcVar18 = pcVar18 + 1;
            } while (cVar6 != '\0');
          }
        }
        uVar27 = uVar27 & uVar25 - 1;
        lVar14 = *(long *)(puVar2 + 4);
        iVar7 = 1;
        uVar22 = uVar27;
        do {
          uVar1 = *(uint *)(lVar14 + (ulong)(uVar22 >> 4) * 4);
          bVar17 = (char)uVar22 * '\x02' & 0x1e;
          uVar8 = uVar1 >> bVar17;
          if ((uVar8 & 2) != 0) {
LAB_0011edfa:
            if ((uVar1 >> bVar17 & 3) == 0) {
              uVar26 = (ulong)uVar22;
            }
            break;
          }
          if ((uVar8 & 1) == 0) {
            pcVar18 = *(char **)(*(long *)(puVar2 + 6) + (ulong)uVar22 * 8);
            *(undefined8 *)((long)a_00 + -8) = 0x11eddd;
            iVar9 = strcmp(pcVar18,(char *)pbVar11);
            if (iVar9 == 0) goto LAB_0011edfa;
          }
          uVar22 = uVar22 + iVar7 & uVar25 - 1;
          iVar7 = iVar7 + 1;
        } while (uVar22 != uVar27);
      }
      v->errcode = 1;
    }
    v->rid = *(int32_t *)(*(long *)(puVar2 + 8) + 0x28 + uVar26 * 0x30);
    break;
  case 1:
    *(undefined8 *)((long)a_00 + -8) = 0x11e757;
    iVar7 = atoi((char *)pbVar11);
    v->pos = iVar7 - 1;
    break;
  case 2:
    *(undefined8 *)((long)a_00 + -8) = 0x11e0d5;
    iVar9 = strcmp((char *)pbVar11,".");
    if (iVar9 == 0) {
      uVar26 = (v->shared).l + 1;
      if ((v->shared).m <= uVar26) {
        uVar26 = uVar26 >> 1 | uVar26;
        uVar26 = uVar26 >> 2 | uVar26;
        uVar26 = uVar26 >> 4 | uVar26;
        uVar26 = uVar26 >> 8 | uVar26;
        sVar23 = (uVar26 >> 0x10 | uVar26) + 1;
        (v->shared).m = sVar23;
        pcVar18 = (v->shared).s;
        *(undefined8 *)((long)a_00 + -8) = 0x11eb27;
        pcVar18 = (char *)realloc(pcVar18,sVar23);
        if (pcVar18 == (char *)0x0) break;
        (v->shared).s = pcVar18;
      }
      sVar3 = (v->shared).l;
      (v->shared).l = sVar3 + 1;
      (v->shared).s[sVar3] = '\a';
      (v->shared).s[(v->shared).l] = '\0';
    }
    else {
      *(undefined8 *)((long)a_00 + -8) = 0x11e0ef;
      bcf_enc_vchar(s_00,iVar7 - (int)pbVar11,(char *)pbVar11);
    }
    break;
  case 3:
    iVar7 = iVar7 - (int)pbVar11;
    *(undefined8 *)((long)a_00 + -8) = 0x11e106;
    bcf_enc_vchar(s_00,iVar7,(char *)pbVar11);
    *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffffff0000ffff | 0x10000;
    v->rlen = iVar7;
    break;
  case 4:
    *(undefined8 *)((long)a_00 + -8) = 0x11e059;
    iVar7 = strcmp((char *)pbVar11,".");
    if (iVar7 != 0) {
      uVar26 = (ulong)pbVar11 & 0xffffffff;
      pbVar19 = pbVar11;
      do {
        pbVar12 = (bcf_idpair_t *)((long)&pbVar19->key + 1);
        if ((*(char *)&pbVar19->key == ',') || (*(char *)&pbVar19->key == '\0')) {
          *(undefined8 *)((long)a_00 + -8) = 0x11e087;
          bcf_enc_vchar(s_00,(int)uVar26 - (int)pbVar11,(char *)pbVar11);
          *(ulong *)&v->field_0x10 =
               *(ulong *)&v->field_0x10 & 0xffffffff0000ffff |
               (ulong)((int)*(ulong *)&v->field_0x10 + 0x10000U & 0xffff0000);
          pbVar11 = pbVar12;
        }
        uVar26 = (ulong)((int)uVar26 + 1);
        bVar28 = pbVar19 != (bcf_idpair_t *)q;
        pbVar19 = pbVar12;
      } while (bVar28);
    }
    break;
  case 5:
    *(undefined8 *)((long)a_00 + -8) = 0x11e772;
    iVar7 = strcmp((char *)pbVar11,".");
    if (iVar7 == 0) {
      v->qual = (float)bcf_float_missing;
    }
    else {
      *(undefined8 *)((long)a_00 + -8) = 0x11e782;
      dVar5 = atof((char *)pbVar11);
      v->qual = (float)dVar5;
    }
    if (v->max_unpack == 1) {
      return 0;
    }
    break;
  case 6:
    *(undefined8 *)((long)a_00 + -8) = 0x11e7a1;
    iVar7 = strcmp((char *)pbVar11,".");
    if (iVar7 != 0) {
      puVar2 = (uint *)h->dict[0];
      if (*(char *)(q + -1) == ';') {
        *(undefined1 *)(q + -1) = 0;
      }
      iVar7 = 1;
      pbVar19 = pbVar11;
      do {
        if (*(char *)&pbVar19->key == ';') {
          iVar7 = iVar7 + 1;
        }
        else if (*(char *)&pbVar19->key == '\0') goto LAB_0011e7da;
        pbVar19 = (bcf_idpair_t *)((long)&pbVar19->key + 1);
      } while( true );
    }
    iVar7 = 0;
    a = (int32_t *)0x0;
    goto LAB_0011ec5f;
  case 7:
    puVar2 = (uint *)h->dict[0];
    *(ulong *)&v->field_0x10 = *(ulong *)&v->field_0x10 & 0xffffffffffff0000;
    *(undefined8 *)((long)a_00 + -8) = 0x11e14d;
    iVar7 = strcmp((char *)pbVar11,".");
    if (iVar7 != 0) {
      pbVar19 = pbVar11;
      if (*(char *)(q + -1) == ';') {
        *(undefined1 *)(q + -1) = 0;
      }
LAB_0011e168:
      bVar17 = *(byte *)&pbVar19->key;
      bVar28 = false;
      if (((ulong)bVar17 < 0x3e) && ((0x2800000000000001U >> ((ulong)bVar17 & 0x3f) & 1) != 0)) {
        *(char *)&pbVar19->key = '\0';
        if (bVar17 == 0x3d) {
          pbVar12 = (bcf_idpair_t *)((long)&pbVar19->key + 1);
          for (pbVar21 = pbVar12; (bVar17 = *(byte *)&pbVar21->key, bVar17 != 0 && (bVar17 != 0x3b))
              ; pbVar21 = (bcf_idpair_t *)((long)&pbVar21->key + 1)) {
          }
          *(char *)&pbVar21->key = '\0';
        }
        else {
          pbVar12 = (bcf_idpair_t *)0x0;
          pbVar21 = pbVar19;
        }
        uVar25 = (uint)*(char *)&pbVar11->key;
        if (*(char *)&pbVar11->key == '\0') {
          if (bVar17 == 0) {
            bVar28 = true;
          }
          else {
            pbVar11 = (bcf_idpair_t *)((long)&pbVar21->key + 1);
            bVar28 = false;
            pbVar19 = pbVar21;
          }
          goto LAB_0011e67c;
        }
        uVar27 = *puVar2;
        if (uVar27 == 0) {
          uVar26 = 0;
        }
        else {
          cVar6 = *(char *)((long)&pbVar11->key + 1);
          if (cVar6 != '\0') {
            pcVar18 = (char *)((long)&pbVar11->key + 2);
            do {
              uVar25 = (int)cVar6 + uVar25 * 0x1f;
              cVar6 = *pcVar18;
              pcVar18 = pcVar18 + 1;
            } while (cVar6 != '\0');
          }
          uVar25 = uVar25 & uVar27 - 1;
          lVar14 = *(long *)(puVar2 + 4);
          iVar7 = 1;
          uVar22 = uVar25;
          do {
            uVar1 = *(uint *)(lVar14 + (ulong)(uVar22 >> 4) * 4);
            bVar16 = (char)uVar22 * '\x02' & 0x1e;
            uVar8 = uVar1 >> bVar16;
            if ((uVar8 & 2) != 0) {
LAB_0011e2a1:
              uVar26 = (ulong)uVar22;
              if ((uVar1 >> bVar16 & 3) != 0) {
                uVar26 = (ulong)uVar27;
              }
              break;
            }
            if ((uVar8 & 1) == 0) {
              pcVar18 = *(char **)(*(long *)(puVar2 + 6) + (ulong)uVar22 * 8);
              *(undefined8 *)((long)a_00 + -8) = 0x11e26a;
              iVar9 = strcmp(pcVar18,(char *)pbVar11);
              if (iVar9 == 0) goto LAB_0011e2a1;
            }
            uVar22 = uVar22 + iVar7 & uVar27 - 1;
            iVar7 = iVar7 + 1;
            uVar26 = (ulong)uVar27;
          } while (uVar22 != uVar25);
        }
        if (((uint)uVar26 == uVar27) || (*(int *)(*(long *)(puVar2 + 8) + 4 + uVar26 * 0x30) == 0xf)
           ) {
          *(undefined8 *)((long)a_00 + -8) = 0x11e4fc;
          fprintf(_stderr,"[W::%s] INFO \'%s\' is not defined in the header, assuming Type=String\n"
                  ,"vcf_parse",pbVar11);
          auStack_c8 = (undefined1  [8])0x0;
          tmp.l = 0;
          tmp.m = 0;
          pbVar24 = (bcf_hdr_t *)auStack_c8;
          *(undefined8 *)((long)a_00 + -8) = 0x11e529;
          ksprintf((kstring_t *)pbVar24,"##INFO=<ID=%s,Number=1,Type=String,Description=\"Dummy\">",
                   pbVar11);
          sVar3 = tmp.m;
          *(undefined8 *)((long)a_00 + -8) = 0x11e53c;
          pbVar15 = bcf_hdr_parse_line(pbVar24,(char *)sVar3,(int *)auStack_e8);
          sVar3 = tmp.m;
          *(undefined8 *)((long)a_00 + -8) = 0x11e54b;
          free((void *)sVar3);
          *(undefined8 *)((long)a_00 + -8) = 0x11e55a;
          iVar7 = bcf_hdr_add_hrec(h,pbVar15);
          if (iVar7 != 0) {
            *(undefined8 *)((long)a_00 + -8) = 0x11e566;
            bcf_hdr_sync(h);
          }
          uVar25 = *puVar2;
          uVar26 = (ulong)uVar25;
          if (uVar25 == 0) {
            uVar26 = 0;
          }
          else {
            uVar27 = (uint)*(char *)&pbVar11->key;
            if (*(char *)&pbVar11->key == '\0') {
              uVar27 = 0;
            }
            else {
              cVar6 = *(char *)((long)&pbVar11->key + 1);
              if (cVar6 != '\0') {
                pcVar18 = (char *)((long)&pbVar11->key + 2);
                do {
                  uVar27 = (int)cVar6 + uVar27 * 0x1f;
                  cVar6 = *pcVar18;
                  pcVar18 = pcVar18 + 1;
                } while (cVar6 != '\0');
              }
            }
            uVar27 = uVar27 & uVar25 - 1;
            lVar14 = *(long *)(puVar2 + 4);
            iVar7 = 1;
            uVar22 = uVar27;
            do {
              uVar1 = *(uint *)(lVar14 + (ulong)(uVar22 >> 4) * 4);
              bVar16 = (char)uVar22 * '\x02' & 0x1e;
              uVar8 = uVar1 >> bVar16;
              if ((uVar8 & 2) != 0) {
LAB_0011e709:
                if ((uVar1 >> bVar16 & 3) == 0) {
                  uVar26 = (ulong)uVar22;
                }
                break;
              }
              if ((uVar8 & 1) == 0) {
                pcVar18 = *(char **)(*(long *)(puVar2 + 6) + (ulong)uVar22 * 8);
                *(undefined8 *)((long)a_00 + -8) = 0x11e6eb;
                iVar9 = strcmp(pcVar18,(char *)pbVar11);
                if (iVar9 == 0) goto LAB_0011e709;
              }
              uVar22 = uVar22 + iVar7 & uVar25 - 1;
              iVar7 = iVar7 + 1;
            } while (uVar22 != uVar27);
          }
          v->errcode = 2;
        }
        uVar25 = *(uint *)(*(long *)(puVar2 + 8) + 4 + uVar26 * 0x30);
        *(short *)&v->field_0x10 = *(short *)&v->field_0x10 + 1;
        x = *(int32_t *)(*(long *)(puVar2 + 8) + 0x28 + uVar26 * 0x30);
        *(undefined8 *)((long)a_00 + -8) = 0x11e310;
        bcf_enc_int1(s_00,x);
        if (pbVar12 == (bcf_idpair_t *)0x0) {
          uVar26 = (v->shared).l + 1;
          if ((v->shared).m <= uVar26) {
            uVar26 = uVar26 >> 1 | uVar26;
            uVar26 = uVar26 >> 2 | uVar26;
            uVar26 = uVar26 >> 4 | uVar26;
            uVar26 = uVar26 >> 8 | uVar26;
            sVar23 = (uVar26 >> 0x10 | uVar26) + 1;
            (v->shared).m = sVar23;
            pcVar18 = (v->shared).s;
            *(undefined8 *)((long)a_00 + -8) = 0x11e398;
            pcVar18 = (char *)realloc(pcVar18,sVar23);
            if (pcVar18 == (char *)0x0) goto LAB_0011e666;
            (v->shared).s = pcVar18;
          }
          sVar3 = (v->shared).l;
          (v->shared).l = sVar3 + 1;
          (v->shared).s[sVar3] = '\0';
          (v->shared).s[(v->shared).l] = '\0';
        }
        else {
          uVar25 = uVar25 >> 4 & 0xf;
          if ((uVar25 != 3) && (uVar25 != 0)) {
            uVar27 = 1;
            pbVar13 = pbVar12;
            do {
              if (*(char *)&pbVar13->key == ',') {
                uVar27 = uVar27 + 1;
              }
              else if (*(char *)&pbVar13->key == '\0') goto LAB_0011e3fa;
              pbVar13 = (bcf_idpair_t *)((long)&pbVar13->key + 1);
            } while( true );
          }
          *(undefined8 *)((long)a_00 + -8) = 0x11e33d;
          bcf_enc_vchar(s_00,(int)pbVar21 - (int)pbVar12,(char *)pbVar12);
        }
        goto LAB_0011e666;
      }
      goto LAB_0011e67c;
    }
LAB_0011e737:
    if (v->max_unpack - 1U < 7) {
      return 0;
    }
    break;
  case 8:
    *(undefined8 *)((long)a_00 + -8) = 0x11ee4a;
    iVar10 = _vcf_parse_format(s,h,v,(char *)pbVar11,(char *)q);
    return iVar10;
  }
  goto switchD_0011dff0_default;
LAB_0011e3fa:
  if (uVar25 == 2) {
    a_00 = (float *)((long)a_00 + -((long)(int)uVar27 * 4 + 0xfU & 0xfffffffffffffff0));
    if (0 < (int)uVar27) {
      uVar26 = 0;
      do {
        a_00[-2] = 1.6437e-39;
        a_00[-1] = 0.0;
        dVar5 = strtod((char *)pbVar12,(char **)auStack_c8);
        a_00[uVar26] = (float)dVar5;
        if (auStack_c8 == (undefined1  [8])pbVar12) {
          a_00[uVar26] = (float)bcf_float_missing;
          for (; (*(char *)&((bcf_idpair_t *)auStack_c8)->key != '\0' &&
                 (*(char *)&((bcf_idpair_t *)auStack_c8)->key != ','));
              auStack_c8 = (undefined1  [8])((long)&((bcf_idpair_t *)auStack_c8)->key + 1)) {
          }
        }
        uVar26 = uVar26 + 1;
        pbVar12 = (bcf_idpair_t *)((long)(char **)auStack_c8 + 1);
      } while (uVar26 != uVar27);
    }
    a_00[-2] = 1.643832e-39;
    a_00[-1] = 0.0;
    bcf_enc_vfloat(s_00,uVar27,a_00);
  }
  else if (uVar25 == 1) {
    a_00 = (float *)((long)a_00 + -((long)(int)uVar27 * 4 + 0xfU & 0xfffffffffffffff0));
    if (0 < (int)uVar27) {
      uVar26 = 0;
      do {
        ((int32_t *)a_00)[-2] = 0x11e44f;
        ((int32_t *)a_00)[-1] = 0;
        lVar14 = strtol((char *)pbVar12,(char **)auStack_c8,10);
        ((int32_t *)a_00)[uVar26] = (int32_t)lVar14;
        if (auStack_c8 == (undefined1  [8])pbVar12) {
          ((int32_t *)a_00)[uVar26] = -0x80000000;
          for (; (*(char *)&((bcf_idpair_t *)auStack_c8)->key != '\0' &&
                 (*(char *)&((bcf_idpair_t *)auStack_c8)->key != ','));
              auStack_c8 = (undefined1  [8])((long)&((bcf_idpair_t *)auStack_c8)->key + 1)) {
          }
        }
        uVar26 = uVar26 + 1;
        pbVar12 = (bcf_idpair_t *)((long)(char **)auStack_c8 + 1);
      } while (uVar26 != uVar27);
    }
    ((int32_t *)a_00)[-2] = 0x11e4aa;
    ((int32_t *)a_00)[-1] = 0;
    bcf_enc_vint(s_00,uVar27,(int32_t *)a_00,-1);
    ((int32_t *)a_00)[-2] = 0x11e4b9;
    ((int32_t *)a_00)[-1] = 0;
    iVar7 = strcmp((char *)pbVar11,"END");
    if (iVar7 == 0) {
      v->rlen = (int)*a_00 - v->pos;
    }
  }
LAB_0011e666:
  bVar28 = bVar17 == 0;
  if (!bVar28) {
    pbVar11 = (bcf_idpair_t *)((long)&pbVar21->key + 1);
    pbVar19 = pbVar21;
  }
LAB_0011e67c:
  pbVar19 = (bcf_idpair_t *)((long)&pbVar19->key + 1);
  if (bVar28) goto LAB_0011e737;
  goto LAB_0011e168;
LAB_0011e7da:
  a = (int32_t *)((long)a_00 + -((long)iVar7 * 4 + 0xfU & 0xfffffffffffffff0));
  a[-2] = 0x11e80e;
  a[-1] = 0;
  pcVar18 = kstrtok((char *)pbVar11,";",(ks_tokaux_t *)auStack_c8);
  if (pcVar18 == (char *)0x0) {
    lVar14 = 0;
  }
  else {
    lVar14 = 0;
    do {
      *(char *)local_a0 = '\0';
      uVar25 = *puVar2;
      if (uVar25 == 0) {
        uVar26 = 0;
      }
      else {
        uVar27 = (uint)*pcVar18;
        if (*pcVar18 == '\0') {
          uVar27 = 0;
        }
        else {
          cVar6 = pcVar18[1];
          if (cVar6 != '\0') {
            pcVar20 = pcVar18 + 2;
            do {
              uVar27 = (int)cVar6 + uVar27 * 0x1f;
              cVar6 = *pcVar20;
              pcVar20 = pcVar20 + 1;
            } while (cVar6 != '\0');
          }
        }
        uVar27 = uVar27 & uVar25 - 1;
        lVar4 = *(long *)(puVar2 + 4);
        iVar7 = 1;
        uVar22 = uVar27;
        do {
          uVar1 = *(uint *)(lVar4 + (ulong)(uVar22 >> 4) * 4);
          bVar17 = (char)uVar22 * '\x02' & 0x1e;
          uVar8 = uVar1 >> bVar17;
          if ((uVar8 & 2) != 0) {
LAB_0011e8f0:
            uVar26 = (ulong)uVar22;
            if ((uVar1 >> bVar17 & 3) != 0) {
              uVar26 = (ulong)uVar25;
            }
            break;
          }
          if ((uVar8 & 1) == 0) {
            pcVar20 = *(char **)(*(long *)(puVar2 + 6) + (ulong)uVar22 * 8);
            a[-2] = 0x11e8cb;
            a[-1] = 0;
            iVar9 = strcmp(pcVar20,pcVar18);
            if (iVar9 == 0) goto LAB_0011e8f0;
          }
          uVar22 = uVar22 + iVar7 & uVar25 - 1;
          iVar7 = iVar7 + 1;
          uVar26 = (ulong)uVar25;
        } while (uVar22 != uVar27);
      }
      if ((uint)uVar26 == uVar25) {
        a[-2] = 0x11e97a;
        a[-1] = 0;
        fprintf(_stderr,"[W::%s] FILTER \'%s\' is not defined in the header\n","vcf_parse",pcVar18);
        auStack_e8._0_4_ = 0;
        auStack_e8._4_4_ = 0;
        l = 0;
        uStack_dc = 0;
        local_d8 = (bcf_idpair_t *)0x0;
        pbVar24 = (bcf_hdr_t *)auStack_e8;
        a[-2] = 0x11e9ab;
        a[-1] = 0;
        ksprintf((kstring_t *)pbVar24,"##FILTER=<ID=%s,Description=\"Dummy\">",pcVar18);
        pbVar11 = local_d8;
        a[-2] = 0x11e9be;
        a[-1] = 0;
        pbVar15 = bcf_hdr_parse_line(pbVar24,(char *)pbVar11,(int *)((long)&aux.p + 4));
        pbVar11 = local_d8;
        a[-2] = 0x11e9cd;
        a[-1] = 0;
        free(pbVar11);
        a[-2] = 0x11e9dc;
        a[-1] = 0;
        iVar7 = bcf_hdr_add_hrec(h,pbVar15);
        if (iVar7 != 0) {
          a[-2] = 0x11e9e8;
          a[-1] = 0;
          bcf_hdr_sync(h);
        }
        uVar25 = *puVar2;
        uVar26 = (ulong)uVar25;
        if (uVar25 == 0) {
          uVar26 = 0;
        }
        else {
          uVar27 = (uint)*pcVar18;
          if (*pcVar18 == '\0') {
            uVar27 = 0;
          }
          else {
            cVar6 = pcVar18[1];
            if (cVar6 != '\0') {
              pcVar20 = pcVar18 + 2;
              do {
                uVar27 = (int)cVar6 + uVar27 * 0x1f;
                cVar6 = *pcVar20;
                pcVar20 = pcVar20 + 1;
              } while (cVar6 != '\0');
            }
          }
          uVar27 = uVar27 & uVar25 - 1;
          lVar4 = *(long *)(puVar2 + 4);
          iVar7 = 1;
          uVar22 = uVar27;
          do {
            uVar1 = *(uint *)(lVar4 + (ulong)(uVar22 >> 4) * 4);
            bVar17 = (char)uVar22 * '\x02' & 0x1e;
            uVar8 = uVar1 >> bVar17;
            if ((uVar8 & 2) != 0) {
LAB_0011eaaa:
              if ((uVar1 >> bVar17 & 3) == 0) {
                uVar26 = (ulong)uVar22;
              }
              break;
            }
            if ((uVar8 & 1) == 0) {
              pcVar20 = *(char **)(*(long *)(puVar2 + 6) + (ulong)uVar22 * 8);
              a[-2] = 0x11ea87;
              a[-1] = 0;
              iVar9 = strcmp(pcVar20,pcVar18);
              if (iVar9 == 0) goto LAB_0011eaaa;
            }
            uVar22 = uVar22 + iVar7 & uVar25 - 1;
            iVar7 = iVar7 + 1;
          } while (uVar22 != uVar27);
        }
        v->errcode = 2;
      }
      a[lVar14] = *(int32_t *)(*(long *)(puVar2 + 8) + 0x28 + uVar26 * 0x30);
      lVar14 = lVar14 + 1;
      a[-2] = 0x11e944;
      a[-1] = 0;
      pcVar18 = kstrtok((char *)0x0,(char *)0x0,(ks_tokaux_t *)auStack_c8);
    } while (pcVar18 != (char *)0x0);
  }
  iVar7 = (int)lVar14;
  a_00 = (float *)a;
LAB_0011ec5f:
  ((int32_t *)a_00)[-2] = 0x11ec69;
  ((int32_t *)a_00)[-1] = 0;
  bcf_enc_vint(s_00,iVar7,a,-1);
  if (v->max_unpack - 1U < 3) {
    return 0;
  }
switchD_0011dff0_default:
  *(undefined8 *)((long)a_00 + -8) = 0x11ec8f;
  pbVar11 = (bcf_idpair_t *)kstrtok((char *)0x0,(char *)0x0,(ks_tokaux_t *)auStack_128);
  iVar10 = iVar10 + 1;
  if (pbVar11 == (bcf_idpair_t *)0x0) {
    return 0;
  }
  goto LAB_0011dfc2;
}

Assistant:

int vcf_parse(kstring_t *s, const bcf_hdr_t *h, bcf1_t *v)
{
    int i = 0;
    char *p, *q, *r, *t;
    kstring_t *str;
    khint_t k;
    ks_tokaux_t aux;

    bcf_clear1(v);
    str = &v->shared;
    memset(&aux, 0, sizeof(ks_tokaux_t));
    for (p = kstrtok(s->s, "\t", &aux), i = 0; p; p = kstrtok(0, 0, &aux), ++i) {
        q = (char*)aux.p;
        *q = 0;
        if (i == 0) { // CHROM
            vdict_t *d = (vdict_t*)h->dict[BCF_DT_CTG];
            k = kh_get(vdict, d, p);
            if (k == kh_end(d))
            {
                // Simple error recovery for chromosomes not defined in the header. It will not help when VCF header has
                // been already printed, but will enable tools like vcfcheck to proceed.
                fprintf(stderr, "[W::%s] contig '%s' is not defined in the header. (Quick workaround: index the file with tabix.)\n", __func__, p);
                kstring_t tmp = {0,0,0};
                int l;
                ksprintf(&tmp, "##contig=<ID=%s>", p);
                bcf_hrec_t *hrec = bcf_hdr_parse_line(h,tmp.s,&l);
                free(tmp.s);
                if ( bcf_hdr_add_hrec((bcf_hdr_t*)h, hrec) ) bcf_hdr_sync((bcf_hdr_t*)h);
                k = kh_get(vdict, d, p);
                v->errcode = BCF_ERR_CTG_UNDEF;
            }
            v->rid = kh_val(d, k).id;
        } else if (i == 1) { // POS
            v->pos = atoi(p) - 1;
        } else if (i == 2) { // ID
            if (strcmp(p, ".")) bcf_enc_vchar(str, q - p, p);
            else bcf_enc_size(str, 0, BCF_BT_CHAR);
        } else if (i == 3) { // REF
            bcf_enc_vchar(str, q - p, p);
            v->n_allele = 1, v->rlen = q - p;
        } else if (i == 4) { // ALT
            if (strcmp(p, ".")) {
                for (r = t = p;; ++r) {
                    if (*r == ',' || *r == 0) {
                        bcf_enc_vchar(str, r - t, t);
                        t = r + 1;
                        ++v->n_allele;
                    }
                    if (r == q) break;
                }
            }
        } else if (i == 5) { // QUAL
            if (strcmp(p, ".")) v->qual = atof(p);
            else memcpy(&v->qual, &bcf_float_missing, 4);
            if ( v->max_unpack && !(v->max_unpack>>1) ) return 0; // BCF_UN_STR
        } else if (i == 6) { // FILTER
            if (strcmp(p, ".")) {
                int32_t *a;
                int n_flt = 1, i;
                ks_tokaux_t aux1;
                vdict_t *d = (vdict_t*)h->dict[BCF_DT_ID];
                // count the number of filters
                if (*(q-1) == ';') *(q-1) = 0;
                for (r = p; *r; ++r)
                    if (*r == ';') ++n_flt;
                a = (int32_t*)alloca(n_flt * sizeof(int32_t));
                // add filters
                for (t = kstrtok(p, ";", &aux1), i = 0; t; t = kstrtok(0, 0, &aux1)) {
                    *(char*)aux1.p = 0;
                    k = kh_get(vdict, d, t);
                    if (k == kh_end(d))
                    {
                        // Simple error recovery for FILTERs not defined in the header. It will not help when VCF header has
                        // been already printed, but will enable tools like vcfcheck to proceed.
                        fprintf(stderr, "[W::%s] FILTER '%s' is not defined in the header\n", __func__, t);
                        kstring_t tmp = {0,0,0};
                        int l;
                        ksprintf(&tmp, "##FILTER=<ID=%s,Description=\"Dummy\">", t);
                        bcf_hrec_t *hrec = bcf_hdr_parse_line(h,tmp.s,&l);
                        free(tmp.s);
                        if ( bcf_hdr_add_hrec((bcf_hdr_t*)h, hrec) ) bcf_hdr_sync((bcf_hdr_t*)h);
                        k = kh_get(vdict, d, t);
                        v->errcode = BCF_ERR_TAG_UNDEF;
                    }
                    a[i++] = kh_val(d, k).id;
                }
                n_flt = i;
                bcf_enc_vint(str, n_flt, a, -1);
            } else bcf_enc_vint(str, 0, 0, -1);
            if ( v->max_unpack && !(v->max_unpack>>2) ) return 0;    // BCF_UN_FLT
        } else if (i == 7) { // INFO
            char *key;
            vdict_t *d = (vdict_t*)h->dict[BCF_DT_ID];
            v->n_info = 0;
            if (strcmp(p, ".")) {
                if (*(q-1) == ';') *(q-1) = 0;
                for (r = key = p;; ++r) {
                    int c;
                    char *val, *end;
                    if (*r != ';' && *r != '=' && *r != 0) continue;
                    val = end = 0;
                    c = *r; *r = 0;
                    if (c == '=') {
                        val = r + 1;
                        for (end = val; *end != ';' && *end != 0; ++end);
                        c = *end; *end = 0;
                    } else end = r;
                    if ( !*key ) { if (c==0) break; r = end; key = r + 1; continue; }  // faulty VCF, ";;" in the INFO
                    k = kh_get(vdict, d, key);
                    if (k == kh_end(d) || kh_val(d, k).info[BCF_HL_INFO] == 15)
                    {
                        fprintf(stderr, "[W::%s] INFO '%s' is not defined in the header, assuming Type=String\n", __func__, key);
                        kstring_t tmp = {0,0,0};
                        int l;
                        ksprintf(&tmp, "##INFO=<ID=%s,Number=1,Type=String,Description=\"Dummy\">", key);
                        bcf_hrec_t *hrec = bcf_hdr_parse_line(h,tmp.s,&l);
                        free(tmp.s);
                        if ( bcf_hdr_add_hrec((bcf_hdr_t*)h, hrec) ) bcf_hdr_sync((bcf_hdr_t*)h);
                        k = kh_get(vdict, d, key);
                        v->errcode = BCF_ERR_TAG_UNDEF;
                    }
                    uint32_t y = kh_val(d, k).info[BCF_HL_INFO];
                    ++v->n_info;
                    bcf_enc_int1(str, kh_val(d, k).id);
                    if (val == 0) {
                        bcf_enc_size(str, 0, BCF_BT_NULL);
                    } else if ((y>>4&0xf) == BCF_HT_FLAG || (y>>4&0xf) == BCF_HT_STR) { // if Flag has a value, treat it as a string
                        bcf_enc_vchar(str, end - val, val);
                    } else { // int/float value/array
                        int i, n_val;
                        char *t, *te;
                        for (t = val, n_val = 1; *t; ++t) // count the number of values
                            if (*t == ',') ++n_val;
                        if ((y>>4&0xf) == BCF_HT_INT) {
                            int32_t *z;
                            z = (int32_t*)alloca(n_val * sizeof(int32_t));
                            for (i = 0, t = val; i < n_val; ++i, ++t)
                            {
                                z[i] = strtol(t, &te, 10);
                                if ( te==t ) // conversion failed
                                {
                                    z[i] = bcf_int32_missing;
                                    while ( *te && *te!=',' ) te++;
                                }
                                t = te;
                            }
                            bcf_enc_vint(str, n_val, z, -1);
                            if (strcmp(key, "END") == 0) v->rlen = z[0] - v->pos;
                        } else if ((y>>4&0xf) == BCF_HT_REAL) {
                            float *z;
                            z = (float*)alloca(n_val * sizeof(float));
                            for (i = 0, t = val; i < n_val; ++i, ++t)
                            {
                                z[i] = strtod(t, &te);
                                if ( te==t ) // conversion failed
                                {
                                    bcf_float_set_missing(z[i]);
                                    while ( *te && *te!=',' ) te++;
                                }
                                t = te;
                            }
                            bcf_enc_vfloat(str, n_val, z);
                        }
                    }
                    if (c == 0) break;
                    r = end;
                    key = r + 1;
                }
            }
            if ( v->max_unpack && !(v->max_unpack>>3) ) return 0;
        } else if (i == 8) // FORMAT
            return _vcf_parse_format(s, h, v, p, q);
    }
    return 0;
}